

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_playback(Pager *pPager,int isHot)

{
  int iVar1;
  int in_ESI;
  Pager *in_RDI;
  int nPlayback;
  int needPagerReset;
  char *zMaster;
  Pager *in_stack_00000010;
  int res;
  int rc;
  Pgno mxPg;
  u32 u;
  u32 nRec;
  i64 szJ;
  sqlite3_vfs *pVfs;
  uint uVar2;
  uint in_stack_ffffffffffffffbc;
  int iVar3;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  uint hasMaster;
  uint in_stack_ffffffffffffffd8;
  Pgno in_stack_ffffffffffffffdc;
  Pager *in_stack_ffffffffffffffe0;
  sqlite3_vfs *pJrnl;
  
  pJrnl = in_RDI->pVfs;
  hasMaster = 0;
  iVar5 = 1;
  pcVar4 = (char *)0x0;
  uVar2 = 0;
  iVar1 = sqlite3OsFileSize((sqlite3_file *)0x0,(i64 *)((ulong)in_stack_ffffffffffffffbc << 0x20));
  if (iVar1 == 0) {
    pcVar4 = in_RDI->pTmpSpace;
    iVar1 = readMasterJournal((sqlite3_file *)pJrnl,(char *)in_stack_ffffffffffffffe0,
                              in_stack_ffffffffffffffdc);
    iVar3 = in_ESI;
    if ((iVar1 == 0) && (*pcVar4 != '\0')) {
      iVar1 = sqlite3OsAccess((sqlite3_vfs *)((ulong)hasMaster << 0x20),
                              (char *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),
                              (int)((ulong)pcVar4 >> 0x20),
                              (int *)CONCAT44(in_stack_ffffffffffffffbc,uVar2));
      iVar3 = in_ESI;
    }
    pcVar4 = (char *)0x0;
    in_ESI = iVar3;
    if ((iVar1 == 0) && (iVar5 != 0)) {
      in_RDI->journalOff = 0;
LAB_00130322:
      iVar1 = readJournalHdr(in_RDI,in_ESI,(i64)pJrnl,(u32 *)in_stack_ffffffffffffffe0,
                             (u32 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (iVar1 == 0) {
        if (in_stack_ffffffffffffffdc == 0xffffffff) {
          in_stack_ffffffffffffffdc =
               (Pgno)((long)((long)in_stack_ffffffffffffffe0 - (ulong)in_RDI->sectorSize) /
                     (long)(in_RDI->pageSize + 8));
        }
        if (((in_stack_ffffffffffffffdc == 0) && (in_ESI == 0)) &&
           (in_RDI->journalHdr + (ulong)in_RDI->sectorSize == in_RDI->journalOff)) {
          in_stack_ffffffffffffffdc =
               (Pgno)(((long)in_stack_ffffffffffffffe0 - in_RDI->journalOff) /
                     (long)(in_RDI->pageSize + 8));
        }
        if (in_RDI->journalOff == (ulong)in_RDI->sectorSize) {
          iVar1 = pager_truncate(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
          if (iVar1 != 0) goto LAB_001304d5;
          in_RDI->dbSize = hasMaster;
        }
        for (in_stack_ffffffffffffffd8 = 0; in_stack_ffffffffffffffd8 < in_stack_ffffffffffffffdc;
            in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
          if (iVar3 != 0) {
            pager_reset((Pager *)0x130454);
            iVar3 = 0;
          }
          iVar1 = pager_playback_one_page
                            (_rc,(i64 *)in_stack_00000010,(Bitvec *)zMaster,needPagerReset,nPlayback
                            );
          if (iVar1 != 0) {
            if (iVar1 != 0x65) {
              if (iVar1 == 0x20a) {
                iVar1 = 0;
              }
              goto LAB_001304d5;
            }
            in_RDI->journalOff = (i64)in_stack_ffffffffffffffe0;
            break;
          }
          uVar2 = uVar2 + 1;
        }
        goto LAB_00130322;
      }
      if (iVar1 == 0x65) {
        iVar1 = 0;
      }
    }
  }
LAB_001304d5:
  in_RDI->changeCountDone = in_RDI->tempFile;
  if (iVar1 == 0) {
    pcVar4 = in_RDI->pTmpSpace;
    iVar1 = readMasterJournal((sqlite3_file *)pJrnl,(char *)in_stack_ffffffffffffffe0,
                              in_stack_ffffffffffffffdc);
  }
  if ((iVar1 == 0) && ((3 < in_RDI->eState || (in_RDI->eState == '\0')))) {
    iVar1 = sqlite3PagerSync((Pager *)((ulong)hasMaster << 0x20),
                             (char *)CONCAT44(iVar5,in_stack_ffffffffffffffc8));
  }
  if (iVar1 == 0) {
    iVar1 = pager_end_transaction
                      ((Pager *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       hasMaster,0);
  }
  if (((iVar1 == 0) && (*pcVar4 != '\0')) && (iVar5 != 0)) {
    iVar1 = pager_delmaster(in_stack_00000010,zMaster);
  }
  if ((in_ESI != 0) && (uVar2 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar2,in_RDI->zJournal);
  }
  setSectorSize((Pager *)0x1305e8);
  return iVar1;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zMaster = 0;       /* Name of master journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the master journal name from the journal, if it is present.
  ** If a master journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  **  mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zMaster = pPager->pTmpSpace;
  rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zMaster[0] ){
    rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
  }
  zMaster = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or 
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error 
  ** occurs. 
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){ 
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages 
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
    }

    /* Copy original pages out of the journal and back into the 
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  if( pPager->fd->pMethods ){
    sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
  }
#endif

  /* If this playback is happening automatically as a result of an IO or 
  ** malloc error that occurred after the change-counter was updated but 
  ** before the transaction was committed, then the change-counter 
  ** modification may just have been reverted. If this happens in exclusive 
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    zMaster = pPager->pTmpSpace;
    rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zMaster[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zMaster[0] && res ){
    /* If there was a master journal and this routine will return success,
    ** see if it is possible to delete the master journal.
    */
    rc = pager_delmaster(pPager, zMaster);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}